

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.cpp
# Opt level: O0

ByteData *
cfd::core::SignatureUtil::CalculateEcSignature
          (ByteData *__return_storage_ptr__,ByteData256 *signature_hash,Privkey *private_key,
          bool has_grind_r)

{
  uint32_t flags;
  uchar *priv_key;
  size_type priv_key_len;
  uchar *bytes;
  size_type bytes_len;
  uchar *bytes_out;
  size_type len;
  undefined8 uVar1;
  allocator_type *in_stack_fffffffffffffeb0;
  string *message;
  size_type in_stack_fffffffffffffeb8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  CfdError error_code;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffec0;
  CfdException *this_00;
  allocator local_e1;
  string local_e0 [32];
  CfdSourceLocation local_c0;
  int local_a8;
  uint32_t local_a4;
  int ret;
  uint32_t flag;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sighash;
  undefined1 local_70 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> privkey_data;
  undefined1 local_40 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  bool has_grind_r_local;
  Privkey *private_key_local;
  ByteData256 *signature_hash_local;
  
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = has_grind_r;
  ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x42f9df);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x42f9ff);
  Privkey::GetData((ByteData *)
                   &sighash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,private_key);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70,
                     (ByteData *)
                     &sighash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  ByteData::~ByteData((ByteData *)0x42fa26);
  ByteData256::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ret,signature_hash);
  local_a4 = 1;
  if ((buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
    local_a4 = 5;
  }
  message = (string *)local_70;
  priv_key = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x42fabf);
  priv_key_len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
  this = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ret;
  bytes = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x42faec);
  bytes_len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(this);
  flags = local_a4;
  error_code = (CfdError)((ulong)this >> 0x20);
  this_00 = (CfdException *)local_40;
  bytes_out = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x42fb22);
  len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
  local_a8 = wally_ec_sig_from_bytes(priv_key,priv_key_len,bytes,bytes_len,flags,bytes_out,len);
  if (local_a8 != 0) {
    local_c0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_transaction_common.cpp"
                 ,0x2f);
    local_c0.filename = local_c0.filename + 1;
    local_c0.line = 0xdf;
    local_c0.funcname = "CalculateEcSignature";
    logger::warn<int&>(&local_c0,"wally_ec_sig_from_bytes NG[{}] ",&local_a8);
    uVar1 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_e0,"ec signature calculation error.",&local_e1);
    CfdException::CfdException(this_00,error_code,message);
    __cxa_throw(uVar1,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ByteData::ByteData(__return_storage_ptr__,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
  return __return_storage_ptr__;
}

Assistant:

ByteData SignatureUtil::CalculateEcSignature(
    const ByteData256 &signature_hash, const Privkey &private_key,
    bool has_grind_r) {
  std::vector<uint8_t> buffer(EC_SIGNATURE_LEN);
  std::vector<uint8_t> privkey_data = private_key.GetData().GetBytes();
  std::vector<uint8_t> sighash = signature_hash.GetBytes();
  uint32_t flag = EC_FLAG_ECDSA;
  if (has_grind_r) {
    flag |= EC_FLAG_GRIND_R;
  }
  int ret = wally_ec_sig_from_bytes(
      privkey_data.data(), privkey_data.size(), sighash.data(), sighash.size(),
      flag, buffer.data(), buffer.size());

  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_ec_sig_from_bytes NG[{}] ", ret);
    throw CfdException(
        kCfdIllegalArgumentError, "ec signature calculation error.");
  }
  return ByteData(buffer);
}